

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

DesugaredObject * __thiscall
jsonnet::internal::Desugarer::stdlibAST(Desugarer *this,string *filename)

{
  BuiltinFunction *pBVar1;
  bool bVar2;
  AST *pAVar3;
  ostream *this_00;
  pointer pFVar4;
  LiteralString *this_01;
  LiteralString *__args_2;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  field;
  BuiltinFunction *fn;
  LiteralString *name;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *p;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  *__range3;
  Identifiers params;
  BuiltinDecl *decl;
  unsigned_long c;
  Fields *fields;
  DesugaredObject *std_obj;
  AST *std_ast;
  Tokens tokens;
  uint in_stack_000006a4;
  AST **in_stack_000006a8;
  Desugarer *in_stack_000006b0;
  char *in_stack_000009d0;
  string *in_stack_000009d8;
  unsigned_long in_stack_00001d78;
  UString *in_stack_fffffffffffffd88;
  BuiltinDecl *in_stack_fffffffffffffd90;
  LocationRange *in_stack_fffffffffffffd98;
  BuiltinDecl *in_stack_fffffffffffffda0;
  UString *in_stack_fffffffffffffda8;
  Fields *__args;
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  *in_stack_fffffffffffffdb0;
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  *this_02;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  in_stack_fffffffffffffdc0;
  BuiltinFunction *in_stack_fffffffffffffdc8;
  LiteralString *in_stack_fffffffffffffdd0;
  DesugaredObject *local_218;
  anon_class_56_1_898aa9a8_for__M_pred *in_stack_fffffffffffffe28;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  in_stack_fffffffffffffe30;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  in_stack_fffffffffffffe38;
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  local_1b9;
  LiteralString *local_198;
  undefined4 local_190;
  undefined4 local_18c;
  Field *local_188;
  Field *local_148;
  Field *local_140;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  local_138;
  string local_130 [32];
  BuiltinFunction *local_110;
  LiteralString *local_108;
  Identifier *local_100;
  reference local_f8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_f0;
  __normal_iterator<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_*,_std::vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
  local_e8;
  undefined1 *local_e0;
  undefined1 local_c0 [56];
  Tokens *in_stack_ffffffffffffff78;
  undefined1 *puVar5;
  Allocator *in_stack_ffffffffffffff80;
  ulong uVar6;
  allocator<char> local_49;
  string local_48 [72];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
             (allocator<char> *)in_stack_fffffffffffffdc0._M_current);
  jsonnet_lex(in_stack_000009d8,in_stack_000009d0);
  ::std::__cxx11::string::~string(local_48);
  ::std::allocator<char>::~allocator(&local_49);
  pAVar3 = jsonnet_parse(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  desugar(in_stack_000006b0,in_stack_000006a8,in_stack_000006a4);
  if (pAVar3 == (AST *)0x0) {
    local_218 = (DesugaredObject *)0x0;
  }
  else {
    local_218 = (DesugaredObject *)
                __dynamic_cast(pAVar3,&AST::typeinfo,&DesugaredObject::typeinfo,0);
  }
  if (local_218 == (DesugaredObject *)0x0) {
    this_00 = ::std::operator<<((ostream *)&::std::cerr,"INTERNAL ERROR: std.jsonnet not an object."
                               );
    ::std::ostream::operator<<(this_00,::std::endl<char,std::char_traits<char>>);
    abort();
  }
  __args = &local_218->fields;
  for (uVar6 = 0; uVar6 <= max_builtin; uVar6 = uVar6 + 1) {
    jsonnet_builtin_decl(in_stack_00001d78);
    puVar5 = local_c0;
    ::std::
    vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::vector((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x350ac6);
    local_e0 = puVar5 + 0x20;
    local_e8._M_current =
         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
         ::std::
         vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                  *)in_stack_fffffffffffffd88);
    local_f0 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               ::std::
               vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                      *)in_stack_fffffffffffffd88);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_*,_std::vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
                          *)in_stack_fffffffffffffd90,
                         (__normal_iterator<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_*,_std::vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
                          *)in_stack_fffffffffffffd88);
      if (!bVar2) break;
      local_f8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_*,_std::vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
                 ::operator*(&local_e8);
      local_100 = id((Desugarer *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      ::std::
      vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::push_back((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   *)in_stack_fffffffffffffd90,(value_type *)in_stack_fffffffffffffd88);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_*,_std::vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
      ::operator++(&local_e8);
    }
    in_stack_fffffffffffffdd0 =
         str((Desugarer *)in_stack_fffffffffffffda0,(UString *)in_stack_fffffffffffffd98);
    local_108 = in_stack_fffffffffffffdd0;
    encode_utf8(in_stack_fffffffffffffda8);
    in_stack_fffffffffffffdc8 =
         make<jsonnet::internal::BuiltinFunction,jsonnet::internal::LocationRange_const&,std::__cxx11::string,std::vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>&>
                   ((Desugarer *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffd90,
                    (vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)in_stack_fffffffffffffd88);
    ::std::__cxx11::string::~string(local_130);
    local_110 = in_stack_fffffffffffffdc8;
    local_140 = (Field *)::std::
                         vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                         ::begin((vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                  *)in_stack_fffffffffffffd88);
    local_148 = (Field *)::std::
                         vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                         ::end((vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                *)in_stack_fffffffffffffd88);
    BuiltinDecl::BuiltinDecl(in_stack_fffffffffffffda0,(BuiltinDecl *)in_stack_fffffffffffffd98);
    in_stack_fffffffffffffdc0 =
         ::std::
         find_if<__gnu_cxx::__normal_iterator<jsonnet::internal::DesugaredObject::Field*,std::vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>>,jsonnet::internal::Desugarer::stdlibAST(std::__cxx11::string)::_lambda(jsonnet::internal::DesugaredObject::Field_const&)_1_>
                   (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_138 = in_stack_fffffffffffffdc0;
    stdlibAST(std::__cxx11::string)::{lambda(jsonnet::internal::DesugaredObject::Field_const&)#1}::
    ~Field((anon_class_56_1_898aa9a8_for__M_pred *)0x350ca8);
    local_188 = (Field *)::std::
                         vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                         ::end((vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                *)in_stack_fffffffffffffd88);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                        *)in_stack_fffffffffffffd90,
                       (__normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                        *)in_stack_fffffffffffffd88);
    pBVar1 = local_110;
    if (bVar2) {
      pFVar4 = __gnu_cxx::
               __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
               ::operator->(&local_138);
      pFVar4->body = &pBVar1->super_AST;
    }
    else {
      local_18c = 0;
      ::std::
      vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
      ::
      emplace_back<jsonnet::internal::ObjectField::Hide,jsonnet::internal::LiteralString*&,jsonnet::internal::BuiltinFunction*&>
                (in_stack_fffffffffffffdb0,(Hide *)in_stack_fffffffffffffda8,
                 (LiteralString **)in_stack_fffffffffffffda0,
                 (BuiltinFunction **)in_stack_fffffffffffffd98);
    }
    ::std::
    vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~vector((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               *)in_stack_fffffffffffffda0);
    BuiltinDecl::~BuiltinDecl(in_stack_fffffffffffffd90);
  }
  local_190 = 0;
  this_02 = &local_1b9;
  ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x350df6);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffffdd0,(char32_t *)in_stack_fffffffffffffdc8,
             (allocator<char32_t> *)in_stack_fffffffffffffdc0._M_current);
  this_01 = str((Desugarer *)in_stack_fffffffffffffda0,(UString *)in_stack_fffffffffffffd98);
  local_198 = this_01;
  decode_utf8((string *)in_stack_fffffffffffffdc8);
  __args_2 = str((Desugarer *)this_01,(UString *)in_stack_fffffffffffffd98);
  ::std::
  vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
  ::
  emplace_back<jsonnet::internal::ObjectField::Hide,jsonnet::internal::LiteralString*,jsonnet::internal::LiteralString*>
            (this_02,(Hide *)__args,(LiteralString **)this_01,(LiteralString **)__args_2);
  ::std::__cxx11::u32string::~u32string(&in_stack_fffffffffffffd90->name);
  ::std::__cxx11::u32string::~u32string(&in_stack_fffffffffffffd90->name);
  ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x350ec2);
  ::std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
            ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)0x350edc);
  return local_218;
}

Assistant:

DesugaredObject *stdlibAST(std::string filename) {
        // Now, implement the std library by wrapping in a local construct.
        Tokens tokens = jsonnet_lex("std.jsonnet", STD_CODE);
        AST *std_ast = jsonnet_parse(alloc, tokens);
        desugar(std_ast, 0);
        auto *std_obj = dynamic_cast<DesugaredObject *>(std_ast);
        if (std_obj == nullptr) {
            std::cerr << "INTERNAL ERROR: std.jsonnet not an object." << std::endl;
            std::abort();
        }

        // Bind 'std' builtins that are implemented natively.
        DesugaredObject::Fields &fields = std_obj->fields;
        for (unsigned long c = 0; c <= max_builtin; ++c) {
            const auto &decl = jsonnet_builtin_decl(c);
            Identifiers params;
            for (const auto &p : decl.params)
                params.push_back(id(p));
            auto name = str(decl.name);
            auto fn = make<BuiltinFunction>(E, encode_utf8(decl.name), params);
            auto field = std::find_if(fields.begin(), fields.end(),
                [=](const DesugaredObject::Field& f) {
                    return static_cast<LiteralString*>(f.name)->value == decl.name;
                });
            if (field != fields.end()) {
                field->body = fn;
            } else {
                fields.emplace_back(ObjectField::HIDDEN, name, fn);
            }
        }
        fields.emplace_back(
            ObjectField::HIDDEN, str(U"thisFile"), str(decode_utf8(filename)));
        return std_obj;
    }